

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v7::detail::bigint::square(bigint *this)

{
  long lVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  _func_int **pp_Var7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint *puVar13;
  uint uVar14;
  bool bVar15;
  undefined1 local_e0 [8];
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            ((basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)local_e0,
             &this->bigits_);
  uVar3 = (this->bigits_).super_buffer<unsigned_int>.size_;
  uVar14 = (uint)uVar3;
  if ((int)uVar14 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                ,0x13c,"negative value");
  }
  uVar4 = (ulong)(uVar14 * 2);
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar4) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar4);
  }
  uVar6 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar6 < uVar4) {
    uVar4 = uVar6;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar4;
  if (uVar14 == 0) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar6 = 1;
    if (1 < (int)uVar14) {
      uVar6 = uVar3 & 0xffffffff;
    }
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar9 = 0;
    uVar3 = 0;
    uVar4 = 0;
    pp_Var7 = n.super_buffer<unsigned_int>._vptr_buffer;
    uVar5 = uVar9;
    do {
      do {
        uVar12 = (ulong)*(uint *)((long)n.super_buffer<unsigned_int>._vptr_buffer + uVar9 * 4) *
                 (ulong)*(uint *)pp_Var7;
        bVar15 = CARRY8(uVar3,uVar12);
        uVar3 = uVar3 + uVar12;
        uVar4 = uVar4 + bVar15;
        bVar15 = uVar9 != 0;
        uVar9 = uVar9 - 1;
        pp_Var7 = (_func_int **)((long)pp_Var7 + 4);
      } while (bVar15);
      puVar2[uVar5] = (uint)uVar3;
      uVar3 = uVar3 >> 0x20 | uVar4 << 0x20;
      uVar4 = uVar4 >> 0x20;
      uVar9 = uVar5 + 1;
      pp_Var7 = n.super_buffer<unsigned_int>._vptr_buffer;
      uVar5 = uVar9;
    } while (uVar9 != uVar6);
  }
  if ((int)uVar14 < (int)(uVar14 * 2)) {
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar6 = (ulong)(uVar14 & 0x7fffffff);
    lVar1 = uVar6 * 4;
    iVar8 = -uVar14;
    uVar10 = 1;
    do {
      if ((int)((int)uVar6 - (uVar14 - 1)) < (int)uVar14) {
        puVar13 = (uint *)((long)n.super_buffer<unsigned_int>._vptr_buffer + (long)(int)uVar10 * 4);
        lVar11 = -1;
        do {
          uVar5 = (ulong)*(uint *)((long)n.super_buffer<unsigned_int>._vptr_buffer +
                                  lVar11 * 4 + lVar1) * (ulong)*puVar13;
          bVar15 = CARRY8(uVar3,uVar5);
          uVar3 = uVar3 + uVar5;
          uVar4 = uVar4 + bVar15;
          lVar11 = lVar11 + -1;
          puVar13 = puVar13 + 1;
        } while (iVar8 != (int)lVar11);
      }
      puVar2[uVar6] = (uint)uVar3;
      uVar3 = uVar3 >> 0x20 | uVar4 << 0x20;
      uVar4 = uVar4 >> 0x20;
      uVar6 = uVar6 + 1;
      iVar8 = iVar8 + 1;
      bVar15 = uVar10 != uVar14;
      uVar10 = uVar10 + 1;
    } while (bVar15);
  }
  n._160_8_ = this;
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  local_e0 = (undefined1  [8])&PTR_grow_004db518;
  if (n.super_buffer<unsigned_int>._vptr_buffer !=
      (_func_int **)&n.super_buffer<unsigned_int>.capacity_) {
    operator_delete(n.super_buffer<unsigned_int>._vptr_buffer,
                    n.super_buffer<unsigned_int>.size_ << 2);
  }
  return;
}

Assistant:

void square() {
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    bigits_.resize(to_unsigned(num_result_bigits));
    using accumulator_t = conditional_t<FMT_USE_INT128, uint128_t, accumulator>;
    auto sum = accumulator_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;
    }
    --num_result_bigits;
    remove_leading_zeros();
    exp_ *= 2;
  }